

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<NodeLinks>::resize
          (btAlignedObjectArray<NodeLinks> *this,int newsize,NodeLinks *fillData)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = this->m_size;
  lVar2 = (long)iVar1;
  if (newsize < iVar1) {
    lVar4 = (long)newsize;
    lVar3 = lVar4 << 5;
    for (; lVar4 < lVar2; lVar4 = lVar4 + 1) {
      btAlignedObjectArray<int>::~btAlignedObjectArray
                ((btAlignedObjectArray<int> *)(&(this->m_data->m_links).field_0x0 + lVar3));
      lVar3 = lVar3 + 0x20;
    }
  }
  else {
    if (iVar1 < newsize) {
      reserve(this,newsize);
    }
    lVar3 = lVar2 << 5;
    for (; lVar2 < newsize; lVar2 = lVar2 + 1) {
      btAlignedObjectArray<int>::btAlignedObjectArray
                ((btAlignedObjectArray<int> *)(&(this->m_data->m_links).field_0x0 + lVar3),
                 &fillData->m_links);
      lVar3 = lVar3 + 0x20;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}